

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# live.cc
# Opt level: O1

void __thiscall
pstack::Procman::LiveReader::LiveReader(LiveReader *this,Context *c,pid_t pid,string *base)

{
  long *local_40 [2];
  long local_30 [2];
  
  pstack::Context::procname((int)(string *)local_40,(string *)c);
  pstack::FileReader::FileReader(&this->super_FileReader,c,(string *)local_40);
  if (local_40[0] != local_30) {
    operator_delete(local_40[0],local_30[0] + 1);
  }
  *(undefined ***)this = &PTR__FileReader_0013f220;
  *(undefined8 *)&this->field_0x40 = 0xffffffffffffffff;
  return;
}

Assistant:

LiveReader::LiveReader(Context &c, pid_t pid, const std::string &base) : FileReader(c, c.procname(pid, base)) {
   fileSize = std::numeric_limits<Reader::Off>::max();
}